

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O1

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::getSamples
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,int *iterations,
          vector<int,_std::allocator<int>_> *samples)

{
  element_type *peVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  FILE *__stream;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  peVar1 = (this->indices_).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  piVar2 = (peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar3 = (peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar5 = (*this->_vptr_SampleConsensusProblem[4])();
  if ((ulong)((long)piVar2 - (long)piVar3 >> 2) < (ulong)(long)iVar5) {
    SampleConsensusProblem<Eigen::Matrix<double,3,4,0,3,4>>::getSamples();
  }
  else {
    iVar5 = (*this->_vptr_SampleConsensusProblem[4])(this);
    std::vector<int,_std::allocator<int>_>::resize(samples,(long)iVar5);
    bVar4 = 0 < this->max_sample_checks_;
    if (0 < this->max_sample_checks_) {
      drawIndexSample(this,samples);
      iVar5 = (*this->_vptr_SampleConsensusProblem[3])(this,samples);
      if ((char)iVar5 == '\0') {
        iVar5 = 0;
        do {
          iVar5 = iVar5 + 1;
          bVar4 = iVar5 < this->max_sample_checks_;
          if (this->max_sample_checks_ <= iVar5) goto LAB_0013bc49;
          drawIndexSample(this,samples);
          iVar6 = (*this->_vptr_SampleConsensusProblem[3])(this,samples);
        } while ((char)iVar6 == '\0');
      }
      if (bVar4) {
        return;
      }
    }
LAB_0013bc49:
    __stream = _stdout;
    uVar7 = (*this->_vptr_SampleConsensusProblem[4])(this);
    fprintf(__stream,
            "[sm::SampleConsensusModel::getSamples] WARNING: Could not select %d sample points in %d iterations!\n"
            ,(ulong)uVar7,(ulong)(uint)this->max_sample_checks_);
    piVar2 = (samples->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((samples->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar2) {
      (samples->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar2;
    }
  }
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::getSamples(
    int &iterations, std::vector<int> &samples)
{
  // We're assuming that indices_ have already been set in the constructor
  if (indices_->size() < (size_t)getSampleSize())
  {
    fprintf( stderr,
        "[sm::SampleConsensusModel::getSamples] Can not select %zu unique points out of %zu!\n",
        (size_t) getSampleSize(), indices_->size() );
    // one of these will make it stop :)
    samples.clear();
    iterations = std::numeric_limits<int>::max();
    return;
  }

  // Get a second point which is different than the first
  samples.resize( getSampleSize() );

  for( int iter = 0; iter < max_sample_checks_; ++iter )
  {
    drawIndexSample(samples);

    // If it's a good sample, stop here
    if(isSampleGood(samples))
      return;
  }
  fprintf( stdout,
      "[sm::SampleConsensusModel::getSamples] WARNING: Could not select %d sample points in %d iterations!\n",
      getSampleSize(), max_sample_checks_ );
  samples.clear();

}